

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubytearray.h
# Opt level: O1

UByteArray * __thiscall
UByteArray::right(UByteArray *__return_storage_ptr__,UByteArray *this,int32_t len)

{
  undefined1 *local_30;
  long local_28;
  undefined1 local_20 [16];
  
  std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
  (__return_storage_ptr__->d)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->d).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_30,local_30 + local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

UByteArray right(int32_t len) const { return d.substr(d.size() - len, len); }